

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTKData.h
# Opt level: O1

type __thiscall
VTKPointDescriptor<MercuryParticle<2UL>_>::addProperty<double[3]>
          (VTKPointDescriptor<MercuryParticle<2UL>_> *this,string *name,
          offset_in_MercuryParticle<2UL>_to_unknown m,bool isPrimary)

{
  pointer *pppVVar1;
  pointer pcVar2;
  iterator __position;
  VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]> *this_00;
  VTKPointDescriptorEntry<MercuryParticle<2UL>_> *data;
  VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]> *local_58;
  string local_50;
  
  this_00 = (VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]> *)operator_new(0x38);
  pcVar2 = (name->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + name->_M_string_length);
  Detail::VTKPointDescriptorEntryImpl<MercuryParticle<2UL>,_double[3]>::VTKPointDescriptorEntryImpl
            (this_00,&local_50,m,3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  __position._M_current =
       (this->entries_).
       super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->entries_).
      super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_58 = this_00;
    std::
    vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2ul>>*,std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2ul>>*>>
    ::_M_realloc_insert<Detail::VTKPointDescriptorEntry<MercuryParticle<2ul>>*const&>
              ((vector<Detail::VTKPointDescriptorEntry<MercuryParticle<2ul>>*,std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2ul>>*>>
                *)this,__position,(VTKPointDescriptorEntry<MercuryParticle<2UL>_> **)&local_58);
  }
  else {
    *__position._M_current = (VTKPointDescriptorEntry<MercuryParticle<2UL>_> *)this_00;
    pppVVar1 = &(this->entries_).
                super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  if (isPrimary) {
    this->positionEntry_ =
         (this->entries_).
         super__Vector_base<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*,_std::allocator<Detail::VTKPointDescriptorEntry<MercuryParticle<2UL>_>_*>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1];
  }
  return this;
}

Assistant:

typename std::enable_if<std::is_array<DATATYPE>::value, VTKPointDescriptor&>::type
     addProperty(std::string name, DATATYPE T::*m, bool isPrimary = false)
  {
    Detail::VTKPointDescriptorEntry<T> * data
       = new Detail::VTKPointDescriptorEntryImpl<T,DATATYPE>(name, m, std::extent<DATATYPE>::value);
    entries_.push_back(data);
    if (isPrimary)
      positionEntry_ = entries_.back();

    return *this;
  }